

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O0

Leaf * __thiscall
SuffixTree::GeneralizedSuffixTree::InsertLeaf
          (GeneralizedSuffixTree *this,uint letter,uint string,uint pos)

{
  Node *pNVar1;
  size_type sVar2;
  Edge local_40;
  Leaf *local_28;
  Leaf *leaf;
  uint local_18;
  uint pos_local;
  uint string_local;
  uint letter_local;
  GeneralizedSuffixTree *this_local;
  
  leaf._4_4_ = pos;
  local_18 = string;
  pos_local = letter;
  _string_local = this;
  if (this->active_length != 0) {
    __assert_fail("!active_length",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]suffixtree/suffixtree.cpp"
                  ,0x119,"Leaf *SuffixTree::GeneralizedSuffixTree::InsertLeaf(uint, uint, uint)");
  }
  sVar2 = std::
          unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
          ::count(&this->active_node->edges,&pos_local);
  if (sVar2 != 0) {
    __assert_fail("!active_node->edges.count (letter)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]suffixtree/suffixtree.cpp"
                  ,0x11a,"Leaf *SuffixTree::GeneralizedSuffixTree::InsertLeaf(uint, uint, uint)");
  }
  local_28 = AllocLeaf(this,this->active_node,local_18);
  pNVar1 = this->active_node;
  Edge::Edge(&local_40,local_28,local_18,leaf._4_4_);
  std::
  unordered_map<unsigned_int,SuffixTree::Edge,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>>
  ::emplace<unsigned_int&,SuffixTree::Edge>
            ((unordered_map<unsigned_int,SuffixTree::Edge,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>>
              *)&pNVar1->edges,&pos_local,&local_40);
  return local_28;
}

Assistant:

Leaf *GeneralizedSuffixTree::InsertLeaf (uint letter, uint string, uint pos)
{
    // can not insert leaf on the middle of edge
    assert (!active_length);
    assert (!active_node->edges.count (letter));
    Leaf *leaf = AllocLeaf (active_node, string);
    active_node->edges.emplace (letter, Edge (leaf, string, pos));
    return leaf;
}